

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O0

size_t __thiscall DObject::PointerSubstitution(DObject *this,DObject *old,DObject *notOld)

{
  PClass *this_00;
  size_t local_38;
  size_t changed;
  size_t *offsets;
  PClass *info;
  DObject *notOld_local;
  DObject *old_local;
  DObject *this_local;
  
  this_00 = GetClass(this);
  changed = (size_t)this_00->FlatPointers;
  local_38 = 0;
  if ((size_t *)changed == (size_t *)0x0) {
    PClass::BuildFlatPointers(this_00);
    changed = (size_t)this_00->FlatPointers;
  }
  for (; *(long *)changed != -1; changed = changed + 8) {
    if (*(DObject **)((long)&this->_vptr_DObject + *(long *)changed) == old) {
      *(DObject **)((long)&this->_vptr_DObject + *(long *)changed) = notOld;
      local_38 = local_38 + 1;
    }
  }
  return local_38;
}

Assistant:

size_t DObject::PointerSubstitution (DObject *old, DObject *notOld)
{
	const PClass *info = GetClass();
	const size_t *offsets = info->FlatPointers;
	size_t changed = 0;
	if (offsets == NULL)
	{
		const_cast<PClass *>(info)->BuildFlatPointers();
		offsets = info->FlatPointers;
	}
	while (*offsets != ~(size_t)0)
	{
		if (*(DObject **)((BYTE *)this + *offsets) == old)
		{
			*(DObject **)((BYTE *)this + *offsets) = notOld;
			changed++;
		}
		offsets++;
	}
	return changed;
}